

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_noise.c
# Opt level: O2

void fe_free_noisestats(noise_stats_t *noise_stats)

{
  ckd_free(noise_stats->signal);
  ckd_free(noise_stats->gain);
  ckd_free(noise_stats->power);
  ckd_free(noise_stats->noise);
  ckd_free(noise_stats->floor);
  ckd_free(noise_stats->peak);
  ckd_free(noise_stats);
  return;
}

Assistant:

void
fe_free_noisestats(noise_stats_t * noise_stats)
{
    ckd_free(noise_stats->signal);
    ckd_free(noise_stats->gain);
    ckd_free(noise_stats->power);
    ckd_free(noise_stats->noise);
    ckd_free(noise_stats->floor);
    ckd_free(noise_stats->peak);
    ckd_free(noise_stats);
}